

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TileSwitch.cpp
# Opt level: O1

void __thiscall TileSwitch::~TileSwitch(TileSwitch *this)

{
  _Hash_node_base *p_Var1;
  Board *pBVar2;
  __node_base_ptr p_Var3;
  size_t __n;
  _Hash_node_base *__dest;
  __hash_code __code;
  _Hash_node_base *p_Var4;
  
  (this->super_Tile)._vptr_Tile = (_func_int **)&PTR__TileSwitch_001d1f88;
  pBVar2 = Tile::getBoardPtr(&this->super_Tile);
  std::
  _Hashtable<TileSwitch_*,_TileSwitch_*,_std::allocator<TileSwitch_*>,_std::__detail::_Identity,_std::equal_to<TileSwitch_*>,_std::hash<TileSwitch_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::_M_erase(&(pBVar2->switchUpdates)._M_h);
  pBVar2 = Tile::getBoardPtr(&this->super_Tile);
  __code = (__hash_code)(char)(this->super_Tile).field_0x21;
  p_Var3 = std::
           _Hashtable<char,_std::pair<const_char,_std::vector<TileSwitch_*,_std::allocator<TileSwitch_*>_>_>,_std::allocator<std::pair<const_char,_std::vector<TileSwitch_*,_std::allocator<TileSwitch_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::_M_find_before_node
                     (&(pBVar2->switchKeybinds)._M_h,
                      __code % (pBVar2->switchKeybinds)._M_h._M_bucket_count,
                      &(this->super_Tile).field_0x21,__code);
  if (p_Var3 == (__node_base_ptr)0x0) {
    p_Var4 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var4 = p_Var3->_M_nxt;
  }
  __dest = p_Var4[2]._M_nxt;
  p_Var1 = p_Var4[3]._M_nxt;
  if (__dest != p_Var1) {
    __n = (long)p_Var1 - (long)__dest;
    do {
      __n = __n - 8;
      if ((TileSwitch *)__dest->_M_nxt == this) {
        if (__dest + 1 != p_Var1) {
          memmove(__dest,__dest + 1,__n);
        }
        p_Var4[3]._M_nxt = p_Var4[3]._M_nxt + -1;
        break;
      }
      __dest = __dest + 1;
    } while (__dest != p_Var1);
  }
  pBVar2 = Tile::getBoardPtr(&this->super_Tile);
  std::
  _Hashtable<Tile_*,_std::pair<Tile_*const,_sf::Text>,_std::allocator<std::pair<Tile_*const,_sf::Text>_>,_std::__detail::_Select1st,_std::equal_to<Tile_*>,_std::hash<Tile_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_erase(&(pBVar2->tileLabels)._M_h);
  Tile::~Tile(&this->super_Tile);
  return;
}

Assistant:

TileSwitch::~TileSwitch() {
    getBoardPtr()->switchUpdates.erase(this);
    auto mapIter = getBoardPtr()->switchKeybinds.find(_charID);
    for (auto vectorIter = mapIter->second.begin(); vectorIter != mapIter->second.end(); ++vectorIter) {
        if (*vectorIter == this) {
            mapIter->second.erase(vectorIter);
            break;
        }
    }
    getBoardPtr()->tileLabels.erase(this);
}